

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadValueRep(CrateReader *this,ValueRep *rep)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  ostringstream ss_e;
  long *local_1a8;
  long local_198 [2];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  bVar1 = StreamReader::read8(this->_sr,&rep->data);
  if (bVar1) {
    uVar3 = this->_memoryUsage + 8;
    this->_memoryUsage = uVar3;
    if (uVar3 <= (this->_config).maxMemoryBudget) {
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_188);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"ReadValueRep",0xc);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_188,0x124);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    pcVar5 = "Reached to max memory budget.";
    lVar4 = 0x1d;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_188);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"ReadValueRep",0xc);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_188,0x120);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    pcVar5 = "Failed to read ValueRep.";
    lVar4 = 0x18;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,pcVar5,lVar4);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1a8);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_188);
  ::std::ios_base::~ios_base(local_118);
  return false;
}

Assistant:

bool CrateReader::ReadValueRep(crate::ValueRep *rep) {
  if (!_sr->read8(reinterpret_cast<uint64_t *>(rep))) {
    PUSH_ERROR("Failed to read ValueRep.");
    return false;
  }

  CHECK_MEMORY_USAGE(sizeof(uint64_t));

  DCOUT("ValueRep value = " << rep->GetData());

  return true;
}